

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

void INT_EVsend_stored(CManager_conflict cm,EVstone stone_num,EVaction action_num)

{
  int iVar1;
  CManager_conflict cm_00;
  event_item *peVar2;
  int in_EDX;
  proto_action *p;
  event_item *item;
  stone_type stone;
  event_path_data evp;
  CManager_conflict in_stack_000000b0;
  event_path_data in_stack_ffffffffffffffc8;
  CManager_conflict cm_01;
  
  cm_00 = (CManager_conflict)stone_struct(in_stack_ffffffffffffffc8,0);
  if (cm_00 != (CManager_conflict)0x0) {
    cm_01 = (CManager_conflict)((_proto_action *)cm_00->reg_user_formats + in_EDX);
    while (peVar2 = storage_queue_dequeue(cm_01,(storage_queue_ptr)in_stack_ffffffffffffffc8),
          peVar2 != (event_item *)0x0) {
      internal_path_submit(cm_00,(int)((ulong)peVar2 >> 0x20),(event_item *)cm_01);
      cm_01->in_format_count = cm_01->in_format_count + -1;
      return_event((event_path_data)item,(event_item *)p);
      do {
        iVar1 = process_local_actions(in_stack_000000b0);
      } while (iVar1 != 0);
    }
  }
  return;
}

Assistant:

void
INT_EVsend_stored(CManager cm, EVstone stone_num, EVaction action_num)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    event_item *item;
    proto_action *p;

    stone = stone_struct(evp, stone_num);
    if (!stone) return;

    p = &stone->proto_actions[action_num];
    while ((item = storage_queue_dequeue(cm, &p->o.store.queue)) != NULL) {
        internal_path_submit(cm, p->o.store.target_stone_id, item);
        p->o.store.num_stored--;
        return_event(evp, item);
        while (process_local_actions(cm));
    }
}